

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluCheckDecOut(word t,int nVars)

{
  ulong uVar1;
  long lVar2;
  
  if (0 < nVars) {
    lVar2 = 0;
    do {
      uVar1 = *(ulong *)((long)Truth6 + lVar2);
      if ((uVar1 & t) == 0) {
        return 1;
      }
      if ((uVar1 & ~t) == 0) {
        return 1;
      }
      if ((~uVar1 & t) == 0) {
        return 1;
      }
      if ((uVar1 | t) == 0xffffffffffffffff) {
        return 1;
      }
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)nVars << 3 != lVar2);
  }
  return 0;
}

Assistant:

int If_CluCheckDecOut( word t, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        if ( 
             (t & Truth6[v]) == 0   ||  //  F * !a
             (~t & Truth6[v]) == 0  ||  // !F * !a
             (t & ~Truth6[v]) == 0  ||  //  F *  a
             (~t & ~Truth6[v]) == 0     // !F *  a   
           )
            return 1;
    return 0;
}